

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pk_internal.h
# Opt level: O0

mbedtls_ecp_group_id mbedtls_pk_get_group_id(mbedtls_pk_context *pk)

{
  mbedtls_pk_context pk_00;
  undefined8 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  mbedtls_ecp_keypair *pmVar4;
  undefined8 in_stack_ffffffffffffffe0;
  mbedtls_ecp_group_id id;
  mbedtls_pk_context *pk_local;
  
  uVar1 = pk->pk_ctx;
  uVar2 = pk->priv_id;
  uVar3 = *(undefined4 *)&pk->field_0x14;
  pk_00.pk_ctx._4_4_ = uVar3;
  pk_00.pk_ctx._0_4_ = uVar2;
  pk_00.pk_info = (mbedtls_pk_info_t *)uVar1;
  pk_00._16_8_ = in_stack_ffffffffffffffe0;
  pmVar4 = mbedtls_pk_ec_ro(pk_00);
  return (pmVar4->grp).id;
}

Assistant:

static inline mbedtls_ecp_group_id mbedtls_pk_get_group_id(const mbedtls_pk_context *pk)
{
    mbedtls_ecp_group_id id;

#if defined(MBEDTLS_USE_PSA_CRYPTO)
    if (mbedtls_pk_get_type(pk) == MBEDTLS_PK_OPAQUE) {
        psa_key_attributes_t opaque_attrs = PSA_KEY_ATTRIBUTES_INIT;
        psa_key_type_t opaque_key_type;
        psa_ecc_family_t curve;

        if (psa_get_key_attributes(pk->priv_id, &opaque_attrs) != PSA_SUCCESS) {
            return MBEDTLS_ECP_DP_NONE;
        }
        opaque_key_type = psa_get_key_type(&opaque_attrs);
        curve = PSA_KEY_TYPE_ECC_GET_FAMILY(opaque_key_type);
        id = mbedtls_ecc_group_of_psa(curve, psa_get_key_bits(&opaque_attrs), 0);
        psa_reset_key_attributes(&opaque_attrs);
    } else
#endif /* MBEDTLS_USE_PSA_CRYPTO */
    {
#if defined(MBEDTLS_PK_USE_PSA_EC_DATA)
        id = mbedtls_ecc_group_of_psa(pk->ec_family, pk->ec_bits, 0);
#else /* MBEDTLS_PK_USE_PSA_EC_DATA */
        id = mbedtls_pk_ec_ro(*pk)->grp.id;
#endif /* MBEDTLS_PK_USE_PSA_EC_DATA */
    }

    return id;
}